

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorWeighted.cpp
# Opt level: O0

void __thiscall AlphaVectorWeighted::BackProjectWeights(AlphaVectorWeighted *this)

{
  ulong uVar1;
  size_t sVar2;
  reference pvVar3;
  long in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Index s1;
  Index s0;
  vector<double,_std::allocator<double>_> w;
  Index ja;
  size_t nrS;
  Index in_stack_ffffffffffffff68;
  Index in_stack_ffffffffffffff6c;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffff70;
  allocator_type *in_stack_ffffffffffffff78;
  PlanningUnitDecPOMDPDiscrete *in_stack_ffffffffffffff80;
  vector<double,_std::allocator<double>_> *this_00;
  uint local_54;
  uint local_50;
  undefined1 local_39 [37];
  uint local_14;
  size_t local_10;
  
  AlphaVectorPlanning::GetPU
            ((AlphaVectorPlanning *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_10 = PlanningUnitMADPDiscrete::GetNrStates(in_stack_ffffffffffffff70);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *)0x956936);
  local_14 = 0;
  while( true ) {
    uVar1 = (ulong)local_14;
    AlphaVectorPlanning::GetPU
              ((AlphaVectorPlanning *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
    ;
    sVar2 = PlanningUnitMADPDiscrete::GetNrJointActions((PlanningUnitMADPDiscrete *)0x956966);
    if (uVar1 == sVar2) break;
    local_39._1_8_ = 0;
    this_00 = (vector<double,_std::allocator<double>_> *)local_39;
    sVar2 = local_10;
    std::allocator<double>::allocator((allocator<double> *)0x95699c);
    std::vector<double,_std::allocator<double>_>::vector
              (this_00,sVar2,(value_type_conflict3 *)in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78);
    std::allocator<double>::~allocator((allocator<double> *)0x9569c1);
    for (local_50 = 0; local_50 != local_10; local_50 = local_50 + 1) {
      for (local_54 = 0; local_54 != local_10; local_54 = local_54 + 1) {
        in_stack_ffffffffffffff80 =
             AlphaVectorPlanning::GetPU
                       ((AlphaVectorPlanning *)
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        in_stack_ffffffffffffff78 =
             (allocator_type *)
             PlanningUnitMADPDiscrete::GetTransitionProbability
                       (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                        in_stack_ffffffffffffff68,0);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x28),
                            (ulong)local_54);
        in_stack_ffffffffffffff70 = (PlanningUnitMADPDiscrete *)*pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_39 + 9),
                            (ulong)local_50);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = in_stack_ffffffffffffff70;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = in_stack_ffffffffffffff78;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = *pvVar3;
        auVar4 = vfmadd213sd_fma(auVar4,auVar5,auVar6);
        *pvVar3 = auVar4._0_8_;
      }
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)in_stack_ffffffffffffff80,(value_type *)in_stack_ffffffffffffff78);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff80);
    local_14 = local_14 + 1;
  }
  *(undefined1 *)(in_RDI + 0x20) = 1;
  return;
}

Assistant:

void AlphaVectorWeighted::BackProjectWeights()
{
    size_t nrS=GetPU()->GetNrStates();

    _m_weightsBackProjected.clear();
    for(Index ja=0;ja!=GetPU()->GetNrJointActions();++ja)
    {
        vector<double> w(nrS,0);
        for(Index s0=0;s0!=nrS;++s0)
            for(Index s1=0;s1!=nrS;++s1)
                w[s0]+=GetPU()->GetTransitionProbability(s0,ja,s1)*
                    _m_weights[s1];

        _m_weightsBackProjected.push_back(w);
    }

    _m_initialized=true;
}